

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O3

void av1_record_txb_context
               (int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,TX_SIZE tx_size,
               void *arg)

{
  int *__dest;
  byte *pbVar1;
  int *piVar2;
  ushort uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int16_t *piVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  size_t __n;
  ulong uVar16;
  char cVar17;
  macroblockd_plane *pd;
  undefined7 in_register_00000089;
  long lVar18;
  int iVar19;
  SCAN_ORDER *scan_order;
  int *qcoeff;
  TXB_CTX txb_ctx;
  
  lVar4 = *(long *)((long)arg + 8);
  lVar13 = (long)plane;
  lVar18 = (long)block;
  lVar12 = **(long **)(lVar4 + 0x2058);
  uVar3 = *(ushort *)(*(long *)(lVar4 + 0x20 + lVar13 * 0x88) + lVar18 * 2);
  lVar5 = *arg;
  uVar16 = (ulong)*(byte *)(lVar4 + 0x1b0 + lVar13 * 0xa30);
  if ((*(int *)(lVar4 + 0x2b64 + (ulong)(*(ushort *)(lVar12 + 0xa7) & 7) * 4) == 0) &&
     ((0x61810UL >> ((ulong)tx_size & 0x3f) & 1) == 0)) {
    if (uVar16 == 0) {
      bVar10 = *(byte *)(*(long *)(lVar4 + 0x2088) +
                        (long)(*(int *)(lVar4 + 0x2090) * blk_row + blk_col));
    }
    else {
      cVar17 = (char)*(ushort *)(lVar12 + 0xa7);
      if ((cVar17 < '\0') || ('\0' < *(char *)(lVar12 + 0x10))) {
        bVar10 = *(byte *)(*(long *)(lVar4 + 0x2088) +
                          (long)((blk_row << (*(byte *)(lVar4 + 0x1b8 + uVar16 * 0xa30) & 0x1f)) *
                                 *(int *)(lVar4 + 0x2090) +
                                (blk_col << (*(byte *)(lVar4 + 0x1b4 + uVar16 * 0xa30) & 0x1f))));
        uVar11 = 1;
        if (-1 < cVar17) {
          uVar11 = (uint)('\0' < *(char *)(lVar12 + 0x10));
        }
      }
      else {
        bVar10 = intra_mode_to_tx_type__intra_mode_to_tx_type
                 [(byte)get_uv_mode_uv2y[*(byte *)(lVar12 + 3)]];
        uVar11 = 0;
      }
      if ((0x18608UL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
        if (*(char *)(lVar5 + 0x3c175) == '\0') {
          uVar11 = (uint)av1_ext_tx_set_lookup[0]
                         [(ulong)((0x60604UL >> ((ulong)tx_size & 0x3f) & 1) != 0) +
                          (ulong)(uVar11 * 2)];
        }
        else {
          uVar11 = (uint)(byte)((uVar11 == 0) + 1);
        }
      }
      if (*(int *)((long)av1_ext_tx_used[0] + (ulong)bVar10 * 4 + (ulong)(uVar11 << 6)) == 0) {
        bVar10 = 0;
      }
    }
  }
  else {
    bVar10 = 0;
  }
  pd = (macroblockd_plane *)(lVar13 * 0xa30 + 0x1b0 + lVar4);
  iVar19 = (int)CONCAT71(in_register_00000089,tx_size);
  scan_order = (SCAN_ORDER *)((long)&av1_scan_orders[0][bVar10].scan + (ulong)(uint)(iVar19 << 8));
  qcoeff = (int *)((long)(block << 4) * 4 + *(long *)(lVar4 + 0x10 + lVar13 * 0x88));
  if (*(char *)((long)arg + 0x15) == '\0') {
    get_txb_ctx(plane_bsize,tx_size,plane,pd->above_entropy_context + blk_col,
                pd->left_entropy_context + blk_row,&txb_ctx);
    lVar6 = *(long *)(lVar4 + 0x4190);
    uVar14 = (ulong)(*(ushort *)(*(long *)(lVar4 + 0x4178) + 0x4e + uVar16 * 2) >> 4);
    lVar7 = *(long *)(lVar6 + 0x18 + lVar13 * 8);
    lVar15 = uVar14 + *(long *)(lVar6 + 0x30 + lVar13 * 8);
    *(undefined1 *)(lVar18 + lVar15) = (undefined1)txb_ctx.txb_skip_ctx;
    *(ushort *)(uVar14 * 2 + lVar7 + lVar18 * 2) = uVar3;
    if (uVar3 == 0) {
      uVar11 = 0;
      goto LAB_001bdc7a;
    }
    if (((0xc < tx_size) || (__n = 0x1000, (0x1810U >> (tx_size & 0x1f) & 1) == 0)) &&
       (__n = 0x800, 1 < (byte)(tx_size - 0x11))) {
      __n = (long)tx_size_2d[CONCAT71(in_register_00000089,tx_size) & 0xffffffff] << 2;
    }
    if ((*(char *)(lVar5 + 0x409b8) != '\0') &&
       ((*(uint *)(lVar5 + 0x40a3c + (ulong)(*(ushort *)(lVar12 + 0xa7) & 7) * 4) & 0x40) != 0)) {
      __n = 0;
    }
    __dest = (int *)((ulong)*(ushort *)(*(long *)(lVar4 + 0x4178) + 0x4e + uVar16 * 2) * 4 +
                     *(long *)(lVar6 + lVar13 * 8) + (long)(block << 4) * 4);
    memcpy(__dest,qcoeff,__n);
    cVar17 = *(char *)(lVar5 + 0x9ae91);
    piVar8 = scan_order->scan;
    piVar2 = (int *)((ulong)(uint)(iVar19 << 6) + lVar4 + 0x256c8 + (ulong)bVar10 * 4);
    *piVar2 = *piVar2 + 1;
    if (cVar17 == '\x01') {
      lVar12 = *(long *)(lVar4 + 0x25d30);
      uVar16 = (ulong)uVar3 + 1;
      do {
        uVar11 = qcoeff[piVar8[uVar16 - 2]];
        uVar9 = -uVar11;
        if (0 < (int)uVar11) {
          uVar9 = uVar11;
        }
        lVar12 = lVar12 + (ulong)uVar9;
        uVar16 = uVar16 - 1;
      } while (1 < uVar16);
      *(long *)(lVar4 + 0x25d30) = lVar12;
    }
    qcoeff = __dest;
    if (*__dest != 0) {
      pbVar1 = (byte *)(lVar15 + lVar18);
      *pbVar1 = *pbVar1 | (char)txb_ctx.dc_sign_ctx << 4;
    }
  }
  bVar10 = av1_get_txb_entropy_context(qcoeff,scan_order,(uint)uVar3);
  uVar11 = (uint)bVar10;
LAB_001bdc7a:
  av1_set_entropy_contexts
            ((MACROBLOCKD *)(lVar4 + 0x1a0),pd,plane,plane_bsize,tx_size,uVar11,blk_col,blk_row);
  return;
}

Assistant:

void av1_record_txb_context(int plane, int block, int blk_row, int blk_col,
                            BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                            void *arg) {
  struct tokenize_b_args *const args = arg;
  const AV1_COMP *cpi = args->cpi;
  const AV1_COMMON *cm = &cpi->common;
  ThreadData *const td = args->td;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  struct macroblock_plane *p = &x->plane[plane];
  struct macroblockd_plane *pd = &xd->plane[plane];
  const int eob = p->eobs[block];
  const int block_offset = BLOCK_OFFSET(block);
  tran_low_t *qcoeff = p->qcoeff + block_offset;
  const PLANE_TYPE plane_type = pd->plane_type;
  const TX_TYPE tx_type =
      av1_get_tx_type(xd, plane_type, blk_row, blk_col, tx_size,
                      cm->features.reduced_tx_set_used);
  const SCAN_ORDER *const scan_order = get_scan(tx_size, tx_type);
  tran_low_t *tcoeff;
  assert(args->dry_run != DRY_RUN_COSTCOEFFS);
  if (args->dry_run == OUTPUT_ENABLED) {
    MB_MODE_INFO *mbmi = xd->mi[0];
    TXB_CTX txb_ctx;
    get_txb_ctx(plane_bsize, tx_size, plane,
                pd->above_entropy_context + blk_col,
                pd->left_entropy_context + blk_row, &txb_ctx);
#if CONFIG_ENTROPY_STATS
    const TX_SIZE txsize_ctx = get_txsize_entropy_ctx(tx_size);
    const int bhl = get_txb_bhl(tx_size);
    const int width = get_txb_wide(tx_size);
    const int height = get_txb_high(tx_size);
    int cdf_idx = cm->coef_cdf_category;
    ++td->counts->txb_skip[cdf_idx][txsize_ctx][txb_ctx.txb_skip_ctx][eob == 0];
#endif  // CONFIG_ENTROPY_STATS

    CB_COEFF_BUFFER *cb_coef_buff = x->cb_coef_buff;
    const int txb_offset = x->mbmi_ext_frame->cb_offset[plane_type] /
                           (TX_SIZE_W_MIN * TX_SIZE_H_MIN);
    uint16_t *eob_txb = cb_coef_buff->eobs[plane] + txb_offset;
    uint8_t *const entropy_ctx = cb_coef_buff->entropy_ctx[plane] + txb_offset;
    entropy_ctx[block] = txb_ctx.txb_skip_ctx;
    eob_txb[block] = eob;

    if (eob == 0) {
      av1_set_entropy_contexts(xd, pd, plane, plane_bsize, tx_size, 0, blk_col,
                               blk_row);
      return;
    }
    const int segment_id = mbmi->segment_id;
    const int seg_eob = av1_get_tx_eob(&cpi->common.seg, segment_id, tx_size);
    tran_low_t *tcoeff_txb =
        cb_coef_buff->tcoeff[plane] + x->mbmi_ext_frame->cb_offset[plane_type];
    tcoeff = tcoeff_txb + block_offset;
    memcpy(tcoeff, qcoeff, sizeof(*tcoeff) * seg_eob);

#if CONFIG_ENTROPY_STATS
    uint8_t levels_buf[TX_PAD_2D];
    uint8_t *const levels = set_levels(levels_buf, height);
    av1_txb_init_levels(tcoeff, width, height, levels);
    update_tx_type_count(cpi, cm, xd, blk_row, blk_col, plane, tx_size,
                         td->counts, 0 /*allow_update_cdf*/);

    const TX_CLASS tx_class = tx_type_to_class[tx_type];
    const bool do_coeff_scan = true;
#else
    const bool do_coeff_scan = cpi->mt_info.pack_bs_mt_enabled;
#endif
    const int16_t *const scan = scan_order->scan;

    // record tx type usage
    td->rd_counts.tx_type_used[tx_size][tx_type]++;

#if CONFIG_ENTROPY_STATS
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    update_eob_context(cdf_idx, eob, tx_size, tx_class, plane_type, ec_ctx,
                       td->counts, 0 /*allow_update_cdf*/);

    DECLARE_ALIGNED(16, int8_t, coeff_contexts[MAX_TX_SQUARE]);
    av1_get_nz_map_contexts(levels, scan, eob, tx_size, tx_class,
                            coeff_contexts);
#endif

    for (int c = eob - 1; (c >= 0) && do_coeff_scan; --c) {
      const int pos = scan[c];
      const tran_low_t v = qcoeff[pos];
      const tran_low_t level = abs(v);
      /* abs_sum_level is needed to decide the job scheduling order of
       * pack bitstream multi-threading. This data is not needed if
       * multi-threading is disabled. */
      if (cpi->mt_info.pack_bs_mt_enabled) td->abs_sum_level += level;

#if CONFIG_ENTROPY_STATS
      const int coeff_ctx = coeff_contexts[pos];
      if (c == eob - 1) {
        assert(coeff_ctx < 4);
        ++td->counts->coeff_base_eob_multi[cdf_idx][txsize_ctx][plane_type]
                                          [coeff_ctx][AOMMIN(level, 3) - 1];
      } else {
        ++td->counts->coeff_base_multi[cdf_idx][txsize_ctx][plane_type]
                                      [coeff_ctx][AOMMIN(level, 3)];
      }
      if (level > NUM_BASE_LEVELS) {
        const int base_range = level - 1 - NUM_BASE_LEVELS;
        const int br_ctx = get_br_ctx(levels, pos, bhl, tx_class);
        for (int idx = 0; idx < COEFF_BASE_RANGE; idx += BR_CDF_SIZE - 1) {
          const int k = AOMMIN(base_range - idx, BR_CDF_SIZE - 1);
          for (int lps = 0; lps < BR_CDF_SIZE - 1; lps++) {
            ++td->counts->coeff_lps[AOMMIN(txsize_ctx, TX_32X32)][plane_type]
                                   [lps][br_ctx][lps == k];
            if (lps == k) break;
          }
          ++td->counts->coeff_lps_multi[cdf_idx][AOMMIN(txsize_ctx, TX_32X32)]
                                       [plane_type][br_ctx][k];
          if (k < BR_CDF_SIZE - 1) break;
        }
      }
#endif
    }
    // Update the context needed to code the DC sign (if applicable)
    if (tcoeff[0] != 0) {
      const int dc_sign_ctx = txb_ctx.dc_sign_ctx;
#if CONFIG_ENTROPY_STATS
      const int dc_sign = (tcoeff[0] < 0) ? 1 : 0;
      ++td->counts->dc_sign[plane_type][dc_sign_ctx][dc_sign];
#endif  // CONFIG_ENTROPY_STATS
      entropy_ctx[block] |= dc_sign_ctx << DC_SIGN_CTX_SHIFT;
    }
  } else {
    tcoeff = qcoeff;
  }
  const uint8_t cul_level =
      av1_get_txb_entropy_context(tcoeff, scan_order, eob);
  av1_set_entropy_contexts(xd, pd, plane, plane_bsize, tx_size, cul_level,
                           blk_col, blk_row);
}